

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O0

double dmach(int job)

{
  ostream *poVar1;
  double dVar2;
  double local_38;
  double value;
  double tiny;
  double s;
  double huge;
  double eps;
  int job_local;
  
  for (huge = 1.0; 1.0 < huge / 2.0 + 1.0; huge = huge / 2.0) {
  }
  tiny = 1.0;
  dVar2 = tiny;
  do {
    do {
      tiny = dVar2;
      dVar2 = tiny / 16.0;
    } while (dVar2 * 1.0 != 0.0);
  } while (NAN(dVar2 * 1.0));
  local_38 = (tiny / huge) * 100.0;
  if (job == 1) {
    local_38 = huge;
  }
  else if ((job != 2) && (local_38 = 1.0 / local_38, job != 3)) {
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"DMACH - Fatal error!\n");
    poVar1 = std::operator<<((ostream *)&std::cout,"  Illegal input value of JOB = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,job);
    std::operator<<(poVar1,"\n");
    exit(1);
  }
  return local_38;
}

Assistant:

double dmach ( int job )

//****************************************************************************80
//
//  Purpose:
//
//    DMACH computes machine parameters of double precision real arithmetic.
//
//  Discussion:
//
//    This routine is for testing only.  It is not required by LINPACK.
//
//    If there is trouble with the automatic computation of these quantities,
//    they can be set by direct assignment statements.
//
//    We assume the computer has
//
//      B = base of arithmetic;
//      T = number of base B digits;
//      L = smallest possible exponent;
//      U = largest possible exponent.
//
//    then
//
//      EPS = B^(1-T)
//      TINY = 100.0 * B^(-L+T)
//      HUGE = 0.01 * B^(U-T)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int JOB:
//    1: requests EPS;
//    2: requests TINY;
//    3: requests HUGE.
//
//    Output, double DMACH, the requested value.
//
{
  double eps;
  double huge;
  double s;
  double tiny;
  double value;

  eps = 1.0;
  for ( ; ; )
  {
    value = 1.0 + ( eps / 2.0 );
    if ( value <= 1.0 )
    {
      break;
    }
    eps = eps / 2.0;
  }

  s = 1.0;

  for ( ; ; )
  {
    tiny = s;
    s = s / 16.0;

    if ( s * 1.0 == 0.0 )
    {
      break;
    }

  }

  tiny = ( tiny / eps ) * 100.0;
  huge = 1.0 / tiny;

  if ( job == 1 )
  {
    value = eps;
  }
  else if ( job == 2 )
  {
    value = tiny;
  }
  else if ( job == 3 )
  {
    value = huge;
  }
  else
  {
    cout << "\n";
    cout << "DMACH - Fatal error!\n";
    cout << "  Illegal input value of JOB = " << job << "\n";
    exit ( 1 );
  }

  return value;
}